

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O0

exr_result_t
DwaCompressor_construct
          (DwaCompressor *me,AcCompression acCompression,exr_encode_pipeline_t *encode,
          exr_decode_pipeline_t *decode)

{
  long lVar1;
  exr_result_t eVar2;
  void *pvVar3;
  long in_RCX;
  long in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  int c_1;
  exr_const_context_t pctxt_1;
  int c;
  exr_const_context_t pctxt;
  exr_result_t rv;
  exr_pixel_type_t in_stack_ffffffffffffff8c;
  DctCoderChannelData *in_stack_ffffffffffffff90;
  float *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  code *pcVar4;
  void **in_stack_ffffffffffffffa8;
  code *pcVar5;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar6;
  int local_3c;
  exr_result_t local_2c;
  
  local_2c = 0;
  initializeFuncs();
  memset(in_RDI,0,0xd0);
  *(undefined4 *)(in_RDI + 2) = in_ESI;
  *in_RDI = in_RDX;
  in_RDI[1] = in_RCX;
  if (in_RDX == 0) {
    lVar1 = *(long *)(in_RCX + 0x18);
    if (lVar1 == 0) {
      pcVar5 = internal_exr_alloc;
    }
    else {
      pcVar5 = *(code **)(lVar1 + 0x58);
    }
    in_RDI[0x17] = (long)pcVar5;
    if (lVar1 == 0) {
      pcVar4 = internal_exr_free;
    }
    else {
      pcVar4 = *(code **)(lVar1 + 0x60);
    }
    in_RDI[0x18] = (long)pcVar4;
    pvVar3 = internal_exr_alloc_aligned
                       ((_func_void_ptr_size_t *)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(size_t)pcVar5);
    in_RDI[6] = (long)pvVar3;
    if (in_RDI[6] == 0) {
      return 1;
    }
    memset((void *)in_RDI[6],0,(long)*(short *)(in_RCX + 0x10) * 0x240);
    *(int *)(in_RDI + 5) = (int)*(short *)(in_RCX + 0x10);
    for (iVar6 = 0; iVar6 < *(short *)(in_RCX + 0x10); iVar6 = iVar6 + 1) {
      *(long *)(in_RDI[6] + (long)iVar6 * 0x240 + 0x1c0) =
           *(long *)(in_RCX + 8) + (long)iVar6 * 0x30;
      *(undefined4 *)(in_RDI[6] + (long)iVar6 * 0x240 + 0x224) = 0;
    }
    *(undefined4 *)((long)in_RDI + 0x14) = *(undefined4 *)(in_RCX + 0x2c);
    *(undefined4 *)(in_RDI + 3) = *(undefined4 *)(in_RCX + 0x24);
    *(undefined4 *)((long)in_RDI + 0x1c) = *(undefined4 *)(in_RCX + 0x28);
    *(int *)(in_RDI + 4) = (int)in_RDI[3] + *(int *)(in_RCX + 0x30) + -1;
    *(int *)((long)in_RDI + 0x24) = *(int *)((long)in_RDI + 0x1c) + *(int *)(in_RCX + 0x2c) + -1;
  }
  else {
    lVar1 = *(long *)(in_RDX + 0x18);
    if (lVar1 == 0) {
      pcVar5 = internal_exr_alloc;
    }
    else {
      pcVar5 = *(code **)(lVar1 + 0x58);
    }
    in_RDI[0x17] = (long)pcVar5;
    if (lVar1 == 0) {
      pcVar4 = internal_exr_free;
    }
    else {
      pcVar4 = *(code **)(lVar1 + 0x60);
    }
    in_RDI[0x18] = (long)pcVar4;
    pvVar3 = internal_exr_alloc_aligned
                       ((_func_void_ptr_size_t *)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        (void **)pcVar5,(size_t)pcVar4,(size_t)in_stack_ffffffffffffff98);
    in_RDI[6] = (long)pvVar3;
    if (in_RDI[6] == 0) {
      return 1;
    }
    memset((void *)in_RDI[6],0,(long)*(short *)(in_RDX + 0x10) * 0x240);
    *(int *)(in_RDI + 5) = (int)*(short *)(in_RDX + 0x10);
    for (local_3c = 0; iVar6 = (int)((ulong)pcVar4 >> 0x20), local_3c < *(short *)(in_RDX + 0x10);
        local_3c = local_3c + 1) {
      *(long *)(in_RDI[6] + (long)local_3c * 0x240 + 0x1c0) =
           *(long *)(in_RDX + 8) + (long)local_3c * 0x30;
      *(undefined4 *)(in_RDI[6] + (long)local_3c * 0x240 + 0x224) = 0;
      DctCoderChannelData_construct(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    }
    *(undefined4 *)((long)in_RDI + 0x14) = *(undefined4 *)(in_RDX + 0x2c);
    *(undefined4 *)(in_RDI + 3) = *(undefined4 *)(in_RDX + 0x24);
    *(undefined4 *)((long)in_RDI + 0x1c) = *(undefined4 *)(in_RDX + 0x28);
    *(int *)(in_RDI + 4) = (int)in_RDI[3] + *(int *)(in_RDX + 0x30) + -1;
    *(int *)((long)in_RDI + 0x24) = *(int *)((long)in_RDI + 0x1c) + *(int *)(in_RDX + 0x2c) + -1;
    eVar2 = exr_get_zip_compression_level
                      ((exr_const_context_t)pcVar5,iVar6,(int *)in_stack_ffffffffffffff98);
    if (eVar2 != 0) {
      return eVar2;
    }
    local_2c = exr_get_dwa_compression_level
                         ((exr_const_context_t)pcVar5,iVar6,in_stack_ffffffffffffff98);
    if (local_2c != 0) {
      return local_2c;
    }
  }
  return local_2c;
}

Assistant:

exr_result_t
DwaCompressor_construct (
    DwaCompressor*         me,
    AcCompression          acCompression,
    exr_encode_pipeline_t* encode,
    exr_decode_pipeline_t* decode)
{
    exr_result_t rv = EXR_ERR_SUCCESS;

    initializeFuncs ();

    memset (me, 0, sizeof (DwaCompressor));

    me->_acCompression = acCompression;

    me->_encode = encode;
    me->_decode = decode;

    if (encode)
    {
        exr_const_context_t pctxt = encode->context;

        me->alloc_fn = pctxt ? pctxt->alloc_fn : internal_exr_alloc;
        me->free_fn  = pctxt ? pctxt->free_fn : internal_exr_free;

        me->_channelData = internal_exr_alloc_aligned (
            me->alloc_fn,
            &(me->_channel_mem),
            sizeof (ChannelData) * (size_t) encode->channel_count,
            _SSE_ALIGNMENT);
        if (!me->_channelData) return EXR_ERR_OUT_OF_MEMORY;

        memset (
            me->_channelData,
            0,
            sizeof (ChannelData) * (size_t) encode->channel_count);

        me->_numChannels = encode->channel_count;
        for (int c = 0; c < encode->channel_count; ++c)
        {
            me->_channelData[c].chan        = encode->channels + c;
            me->_channelData[c].compression = UNKNOWN;
            DctCoderChannelData_construct (
                &(me->_channelData[c]._dctData),
                me->_channelData[c].chan->data_type);
        }

        // DWAA should be 32, DWAB should be 256
        me->_numScanLines = encode->chunk.height;

        me->_min[0] = encode->chunk.start_x;
        me->_min[1] = encode->chunk.start_y;
        me->_max[0] = me->_min[0] + encode->chunk.width - 1;
        me->_max[1] = me->_min[1] + encode->chunk.height - 1;

        rv = exr_get_zip_compression_level (
            encode->context, encode->part_index, &(me->_zipLevel));
        if (rv != EXR_ERR_SUCCESS) return rv;
        rv = exr_get_dwa_compression_level (
            encode->context, encode->part_index, &(me->_dwaCompressionLevel));
        if (rv != EXR_ERR_SUCCESS) return rv;
    }
    else
    {
        exr_const_context_t pctxt = decode->context;

        me->alloc_fn = pctxt ? pctxt->alloc_fn : internal_exr_alloc;
        me->free_fn  = pctxt ? pctxt->free_fn : internal_exr_free;

        me->_channelData = internal_exr_alloc_aligned (
            me->alloc_fn,
            &(me->_channel_mem),
            sizeof (ChannelData) * (size_t) decode->channel_count,
            _SSE_ALIGNMENT);
        if (!me->_channelData) return EXR_ERR_OUT_OF_MEMORY;

        memset (
            me->_channelData,
            0,
            sizeof (ChannelData) * (size_t) decode->channel_count);

        me->_numChannels = decode->channel_count;
        for (int c = 0; c < decode->channel_count; ++c)
        {
            me->_channelData[c].chan        = decode->channels + c;
            me->_channelData[c].compression = UNKNOWN;
        }

        me->_numScanLines = decode->chunk.height;

        me->_min[0] = decode->chunk.start_x;
        me->_min[1] = decode->chunk.start_y;
        me->_max[0] = me->_min[0] + decode->chunk.width - 1;
        me->_max[1] = me->_min[1] + decode->chunk.height - 1;
    }
    return rv;
}